

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool __thiscall
basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
          (basisu_lowlevel_etc1s_transcoder *this,uint32_t num_endpoints,uint8_t *pEndpoints_data,
          uint32_t endpoints_data_size,uint32_t num_selectors,uint8_t *pSelectors_data,
          uint32_t selectors_data_size)

{
  endpoint_vec *this_00;
  uint8_t uVar1;
  uint8_t uVar2;
  bool bVar3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  endpoint *peVar8;
  byte *pbVar9;
  uint8_t *puVar10;
  selector *psVar11;
  bool bVar12;
  uint32_t k;
  long lVar13;
  huffman_decoding_table *ct;
  ulong new_size_size_t;
  size_t i;
  selector_vec *this_01;
  uint32_t c;
  byte bVar14;
  byte bVar15;
  size_t sVar16;
  uint8_t prev_bytes [4];
  bitwise_decoder sym_codec;
  anon_union_4_3_898e29d3_for_color32_0 local_12c;
  huffman_decoding_table delta_selector_pal_model;
  huffman_decoding_table inten_delta_model;
  huffman_decoding_table color5_delta_model2;
  huffman_decoding_table color5_delta_model1;
  huffman_decoding_table color5_delta_model0;
  
  if (this->m_pGlobal_codebook != (basisu_lowlevel_etc1s_transcoder *)0x0) {
    return false;
  }
  sym_codec.m_buf_size = 0;
  sym_codec.m_pBuf = (uint8_t *)0x0;
  sym_codec.m_pBuf_start = (uint8_t *)0x0;
  sym_codec.m_pBuf_end = (uint8_t *)0x0;
  sym_codec.m_bit_buf = 0;
  sym_codec.m_bit_buf_size = 0;
  color5_delta_model0.m_tree.m_p = (short *)0x0;
  color5_delta_model0.m_tree.m_size = 0;
  color5_delta_model0.m_tree.m_capacity = 0;
  color5_delta_model0.m_lookup.m_p = (int *)0x0;
  color5_delta_model0.m_lookup.m_size = 0;
  color5_delta_model0.m_lookup.m_capacity = 0;
  color5_delta_model0.m_code_sizes.m_p = (uchar *)0x0;
  color5_delta_model0.m_code_sizes.m_size = 0;
  color5_delta_model0.m_code_sizes.m_capacity = 0;
  color5_delta_model1.m_tree.m_p = (short *)0x0;
  color5_delta_model1.m_tree.m_size = 0;
  color5_delta_model1.m_tree.m_capacity = 0;
  color5_delta_model1.m_lookup.m_p = (int *)0x0;
  color5_delta_model1.m_lookup.m_size = 0;
  color5_delta_model1.m_lookup.m_capacity = 0;
  color5_delta_model1.m_code_sizes.m_p = (uchar *)0x0;
  color5_delta_model1.m_code_sizes.m_size = 0;
  color5_delta_model1.m_code_sizes.m_capacity = 0;
  color5_delta_model2.m_tree.m_p = (short *)0x0;
  color5_delta_model2.m_tree.m_size = 0;
  color5_delta_model2.m_tree.m_capacity = 0;
  color5_delta_model2.m_lookup.m_p = (int *)0x0;
  color5_delta_model2.m_lookup.m_size = 0;
  color5_delta_model2.m_lookup.m_capacity = 0;
  color5_delta_model2.m_code_sizes.m_p = (uchar *)0x0;
  color5_delta_model2.m_code_sizes.m_size = 0;
  color5_delta_model2.m_code_sizes.m_capacity = 0;
  inten_delta_model.m_tree.m_p = (short *)0x0;
  inten_delta_model.m_tree.m_size = 0;
  inten_delta_model.m_tree.m_capacity = 0;
  inten_delta_model.m_lookup.m_p = (int *)0x0;
  inten_delta_model.m_lookup.m_size = 0;
  inten_delta_model.m_lookup.m_capacity = 0;
  inten_delta_model.m_code_sizes.m_p = (uchar *)0x0;
  inten_delta_model.m_code_sizes.m_size = 0;
  inten_delta_model.m_code_sizes.m_capacity = 0;
  if (endpoints_data_size == 0 || pEndpoints_data != (uint8_t *)0x0) {
    sym_codec.m_pBuf_end = pEndpoints_data + endpoints_data_size;
    sym_codec.m_bit_buf = 0;
    sym_codec.m_bit_buf_size = 0;
    sym_codec.m_buf_size = endpoints_data_size;
    sym_codec.m_pBuf = pEndpoints_data;
    sym_codec.m_pBuf_start = pEndpoints_data;
    bVar3 = bitwise_decoder::read_huffman_table(&sym_codec,&color5_delta_model0);
    if (((bVar3) &&
        (bVar3 = bitwise_decoder::read_huffman_table(&sym_codec,&color5_delta_model1), bVar3)) &&
       (bVar3 = bitwise_decoder::read_huffman_table(&sym_codec,&color5_delta_model2), bVar3)) {
      bVar4 = bitwise_decoder::read_huffman_table(&sym_codec,&inten_delta_model);
      bVar12 = false;
      bVar3 = false;
      if (((!bVar4 || color5_delta_model0.m_code_sizes.m_size == 0) ||
          (bVar3 = bVar12, color5_delta_model1.m_code_sizes.m_size == 0)) ||
         ((color5_delta_model2.m_code_sizes.m_size == 0 ||
          (inten_delta_model.m_code_sizes.m_size == 0)))) goto LAB_0012001a;
      uVar5 = bitwise_decoder::get_bits(&sym_codec,1);
      this_00 = &this->m_local_endpoints;
      uVar1 = '\0';
      basisu::vector<basist::endpoint>::resize(this_00,(ulong)num_endpoints,false);
      local_12c.m = 0x101010;
      for (sVar16 = 0; sVar16 != num_endpoints; sVar16 = sVar16 + 1) {
        uVar6 = bitwise_decoder::decode_huffman(&sym_codec,&inten_delta_model,10);
        peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
        peVar8->m_inten5 = (char)uVar6 + uVar1 & 7;
        peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
        uVar1 = peVar8->m_inten5;
        for (uVar6 = 0; (uint)(uVar5 == 0) * 2 + 1 != uVar6; uVar6 = uVar6 + 1) {
          pbVar9 = color32::operator[]((color32 *)&local_12c.field_0,uVar6);
          ct = &color5_delta_model0;
          if (9 < *pbVar9) {
            pbVar9 = color32::operator[]((color32 *)&local_12c.field_0,uVar6);
            ct = &color5_delta_model2;
            if (*pbVar9 < 0x16) {
              ct = &color5_delta_model1;
            }
          }
          uVar7 = bitwise_decoder::decode_huffman(&sym_codec,ct,10);
          puVar10 = color32::operator[]((color32 *)&local_12c.field_0,uVar6);
          bVar14 = (char)uVar7 + *puVar10 & 0x1f;
          peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
          pbVar9 = color32::operator[](&peVar8->m_color5,uVar6);
          *pbVar9 = bVar14;
          pbVar9 = color32::operator[]((color32 *)&local_12c.field_0,uVar6);
          *pbVar9 = bVar14;
        }
        if (uVar5 != 0) {
          peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
          uVar2 = (peVar8->m_color5).field_0.field_0.r;
          peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
          (peVar8->m_color5).field_0.field_0.g = uVar2;
          peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
          uVar2 = (peVar8->m_color5).field_0.field_0.r;
          peVar8 = basisu::vector<basist::endpoint>::operator[](this_00,sVar16);
          (peVar8->m_color5).field_0.field_0.b = uVar2;
        }
      }
      this_01 = &this->m_local_selectors;
      new_size_size_t = (ulong)num_selectors;
      basisu::vector<basist::selector>::resize(this_01,new_size_size_t,false);
      if (selectors_data_size == 0 || pSelectors_data != (uint8_t *)0x0) {
        sym_codec.m_buf_size = selectors_data_size;
        sym_codec.m_pBuf_end = pSelectors_data + selectors_data_size;
        sym_codec.m_bit_buf = 0;
        sym_codec.m_bit_buf_size = 0;
        delta_selector_pal_model.m_tree.m_p = (short *)0x0;
        delta_selector_pal_model.m_tree.m_size = 0;
        delta_selector_pal_model.m_tree.m_capacity = 0;
        delta_selector_pal_model.m_lookup.m_p = (int *)0x0;
        delta_selector_pal_model.m_lookup.m_size = 0;
        delta_selector_pal_model.m_lookup.m_capacity = 0;
        delta_selector_pal_model.m_code_sizes.m_p = (uchar *)0x0;
        delta_selector_pal_model.m_code_sizes.m_size = 0;
        delta_selector_pal_model.m_code_sizes.m_capacity = 0;
        sym_codec.m_pBuf = pSelectors_data;
        sym_codec.m_pBuf_start = pSelectors_data;
        uVar5 = bitwise_decoder::get_bits(&sym_codec,1);
        if ((uVar5 == 1) || (uVar5 = bitwise_decoder::get_bits(&sym_codec,1), uVar5 == 1)) {
LAB_0012000a:
          bVar3 = false;
        }
        else {
          uVar5 = bitwise_decoder::get_bits(&sym_codec,1);
          if (uVar5 == 1) {
            for (sVar16 = 0; sVar16 != new_size_size_t; sVar16 = sVar16 + 1) {
              for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
                uVar6 = bitwise_decoder::get_bits(&sym_codec,8);
                bVar14 = 0;
                for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
                  psVar11 = basisu::vector<basist::selector>::operator[](this_01,sVar16);
                  selector::set_selector(psVar11,uVar7,uVar5,uVar6 >> (bVar14 & 0x1f) & 3);
                  bVar14 = bVar14 + 2;
                }
              }
              psVar11 = basisu::vector<basist::selector>::operator[](this_01,sVar16);
              selector::init_flags(psVar11);
            }
          }
          else {
            bVar3 = bitwise_decoder::read_huffman_table(&sym_codec,&delta_selector_pal_model);
            if ((!bVar3) ||
               ((1 < num_selectors && (delta_selector_pal_model.m_code_sizes.m_size == 0))))
            goto LAB_0012000a;
            prev_bytes[0] = '\0';
            prev_bytes[1] = '\0';
            prev_bytes[2] = '\0';
            prev_bytes[3] = '\0';
            for (sVar16 = 0; sVar16 != new_size_size_t; sVar16 = sVar16 + 1) {
              lVar13 = 0;
              if (sVar16 == 0) {
                for (; lVar13 != 4; lVar13 = lVar13 + 1) {
                  uVar5 = bitwise_decoder::get_bits(&sym_codec,8);
                  prev_bytes[lVar13] = (uint8_t)uVar5;
                  bVar14 = 0;
                  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
                    psVar11 = basisu::vector<basist::selector>::operator[](this_01,0);
                    selector::set_selector
                              (psVar11,uVar6,(uint32_t)lVar13,uVar5 >> (bVar14 & 0x1f) & 3);
                    bVar14 = bVar14 + 2;
                  }
                }
                i = 0;
              }
              else {
                for (; i = sVar16, lVar13 != 4; lVar13 = lVar13 + 1) {
                  uVar5 = bitwise_decoder::decode_huffman(&sym_codec,&delta_selector_pal_model,10);
                  bVar14 = prev_bytes[lVar13];
                  prev_bytes[lVar13] = (uint8_t)(uVar5 ^ bVar14);
                  bVar15 = 0;
                  for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
                    psVar11 = basisu::vector<basist::selector>::operator[](this_01,sVar16);
                    selector::set_selector
                              (psVar11,uVar6,(uint32_t)lVar13,
                               (uVar5 ^ bVar14) >> (bVar15 & 0x1f) & 3);
                    bVar15 = bVar15 + 2;
                  }
                }
              }
              psVar11 = basisu::vector<basist::selector>::operator[](this_01,i);
              selector::init_flags(psVar11);
            }
          }
          bVar3 = true;
        }
        huffman_decoding_table::~huffman_decoding_table(&delta_selector_pal_model);
        goto LAB_0012001a;
      }
    }
  }
  bVar3 = false;
LAB_0012001a:
  huffman_decoding_table::~huffman_decoding_table(&inten_delta_model);
  huffman_decoding_table::~huffman_decoding_table(&color5_delta_model2);
  huffman_decoding_table::~huffman_decoding_table(&color5_delta_model1);
  huffman_decoding_table::~huffman_decoding_table(&color5_delta_model0);
  return bVar3;
}

Assistant:

bool basisu_lowlevel_etc1s_transcoder::decode_palettes(
		uint32_t num_endpoints, const uint8_t* pEndpoints_data, uint32_t endpoints_data_size,
		uint32_t num_selectors, const uint8_t* pSelectors_data, uint32_t selectors_data_size)
	{
		if (m_pGlobal_codebook)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 11\n");
			return false;
		}
		bitwise_decoder sym_codec;

		huffman_decoding_table color5_delta_model0, color5_delta_model1, color5_delta_model2, inten_delta_model;

		if (!sym_codec.init(pEndpoints_data, endpoints_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 0\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model0))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model1))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 1a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(color5_delta_model2))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2a\n");
			return false;
		}

		if (!sym_codec.read_huffman_table(inten_delta_model))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		if (!color5_delta_model0.is_valid() || !color5_delta_model1.is_valid() || !color5_delta_model2.is_valid() || !inten_delta_model.is_valid())
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 2b\n");
			return false;
		}

		const bool endpoints_are_grayscale = sym_codec.get_bits(1) != 0;

		m_local_endpoints.resize(num_endpoints);

		color32 prev_color5(16, 16, 16, 0);
		uint32_t prev_inten = 0;

		for (uint32_t i = 0; i < num_endpoints; i++)
		{
			uint32_t inten_delta = sym_codec.decode_huffman(inten_delta_model);
			m_local_endpoints[i].m_inten5 = static_cast<uint8_t>((inten_delta + prev_inten) & 7);
			prev_inten = m_local_endpoints[i].m_inten5;

			for (uint32_t c = 0; c < (endpoints_are_grayscale ? 1U : 3U); c++)
			{
				int delta;
				if (prev_color5[c] <= basist::COLOR5_PAL0_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model0);
				else if (prev_color5[c] <= basist::COLOR5_PAL1_PREV_HI)
					delta = sym_codec.decode_huffman(color5_delta_model1);
				else
					delta = sym_codec.decode_huffman(color5_delta_model2);

				int v = (prev_color5[c] + delta) & 31;

				m_local_endpoints[i].m_color5[c] = static_cast<uint8_t>(v);

				prev_color5[c] = static_cast<uint8_t>(v);
			}

			if (endpoints_are_grayscale)
			{
				m_local_endpoints[i].m_color5[1] = m_local_endpoints[i].m_color5[0];
				m_local_endpoints[i].m_color5[2] = m_local_endpoints[i].m_color5[0];
			}
		}

		sym_codec.stop();

		m_local_selectors.resize(num_selectors);
		
		if (!sym_codec.init(pSelectors_data, selectors_data_size))
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 5\n");
			return false;
		}

		basist::huffman_decoding_table delta_selector_pal_model;

		const bool used_global_selector_cb = (sym_codec.get_bits(1) == 1);

		if (used_global_selector_cb)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: global selector codebooks are unsupported\n");
			return false;
		}
		else
		{
			const bool used_hybrid_selector_cb = (sym_codec.get_bits(1) == 1);

			if (used_hybrid_selector_cb)
			{
				BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: hybrid global selector codebooks are unsupported\n");
				return false;
			}
				
			const bool used_raw_encoding = (sym_codec.get_bits(1) == 1);

			if (used_raw_encoding)
			{
				for (uint32_t i = 0; i < num_selectors; i++)
				{
					for (uint32_t j = 0; j < 4; j++)
					{
						uint32_t cur_byte = sym_codec.get_bits(8);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}

					m_local_selectors[i].init_flags();
				}
			}
			else
			{
				if (!sym_codec.read_huffman_table(delta_selector_pal_model))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10\n");
					return false;
				}

				if ((num_selectors > 1) && (!delta_selector_pal_model.is_valid()))
				{
					BASISU_DEVEL_ERROR("basisu_lowlevel_etc1s_transcoder::decode_palettes: fail 10a\n");
					return false;
				}

				uint8_t prev_bytes[4] = { 0, 0, 0, 0 };

				for (uint32_t i = 0; i < num_selectors; i++)
				{
					if (!i)
					{
						for (uint32_t j = 0; j < 4; j++)
						{
							uint32_t cur_byte = sym_codec.get_bits(8);
							prev_bytes[j] = static_cast<uint8_t>(cur_byte);

							for (uint32_t k = 0; k < 4; k++)
								m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
						}
						m_local_selectors[i].init_flags();
						continue;
					}

					for (uint32_t j = 0; j < 4; j++)
					{
						int delta_byte = sym_codec.decode_huffman(delta_selector_pal_model);

						uint32_t cur_byte = delta_byte ^ prev_bytes[j];
						prev_bytes[j] = static_cast<uint8_t>(cur_byte);

						for (uint32_t k = 0; k < 4; k++)
							m_local_selectors[i].set_selector(k, j, (cur_byte >> (k * 2)) & 3);
					}
					m_local_selectors[i].init_flags();
				}
			}
		}

		sym_codec.stop();

		return true;
	}